

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::UniversalPrinter<(anonymous_namespace)::TestVideoParam>::Print
               (anon_struct_24_5_c1269b3d_for__M_head_impl *value,ostream *os)

{
  anon_struct_24_5_c1269b3d_for__M_head_impl *in_RSI;
  ostream *in_stack_ffffffffffffffe8;
  
  PrintTo<(anonymous_namespace)::TestVideoParam>(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void Print(const T& value, ::std::ostream* os) {
    // By default, ::testing::internal::PrintTo() is used for printing
    // the value.
    //
    // Thanks to Koenig look-up, if T is a class and has its own
    // PrintTo() function defined in its namespace, that function will
    // be visible here.  Since it is more specific than the generic ones
    // in ::testing::internal, it will be picked by the compiler in the
    // following statement - exactly what we want.
    PrintTo(value, os);
  }